

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

pair<cmTarget_&,_bool> __thiscall
cmMakefile::CreateNewTarget(cmMakefile *this,string *name,TargetType type,PerConfig perConfig)

{
  undefined8 extraout_RDX;
  undefined8 uVar1;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *t;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>,_bool>
  pVar2;
  pair<cmTarget_&,_bool> pVar3;
  cmStateDirectory local_70;
  cmStateSnapshot local_48;
  
  cmTarget::cmTarget((cmTarget *)&local_70,name,type,VisibilityNormal,this,perConfig);
  pVar2 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string_const&,cmTarget>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->Targets,name,&local_70);
  cmTarget::~cmTarget((cmTarget *)&local_70);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar1 = 0;
  }
  else {
    t = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
        ((long)pVar2.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
               ._M_cur.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
        + 0x28);
    local_70.DirectoryState.Tree = t;
    std::vector<cmTarget*,std::allocator<cmTarget*>>::emplace_back<cmTarget*>
              ((vector<cmTarget*,std::allocator<cmTarget*>> *)&this->OrderedTargets,
               (cmTarget **)&local_70);
    cmGlobalGenerator::IndexTarget(this->GlobalGenerator,(cmTarget *)t);
    local_48.Position.Position = (this->StateSnapshot).Position.Position;
    local_48.State = (this->StateSnapshot).State;
    local_48.Position.Tree = (this->StateSnapshot).Position.Tree;
    cmStateSnapshot::GetDirectory(&local_70,&local_48);
    cmStateDirectory::AddNormalTargetName(&local_70,name);
    uVar1 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  pVar3._8_8_ = uVar1;
  pVar3.first = (cmTarget *)
                ((long)pVar2.first.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                       ._M_cur.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                + 0x28);
  return pVar3;
}

Assistant:

std::pair<cmTarget&, bool> cmMakefile::CreateNewTarget(
  const std::string& name, cmStateEnums::TargetType type,
  cmTarget::PerConfig perConfig)
{
  auto ib = this->Targets.emplace(
    name, cmTarget(name, type, cmTarget::VisibilityNormal, this, perConfig));
  auto it = ib.first;
  if (!ib.second) {
    return std::make_pair(std::ref(it->second), false);
  }
  this->OrderedTargets.push_back(&it->second);
  this->GetGlobalGenerator()->IndexTarget(&it->second);
  this->GetStateSnapshot().GetDirectory().AddNormalTargetName(name);
  return std::make_pair(std::ref(it->second), true);
}